

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleMenuFile(void)

{
  bool bVar1;
  ImDrawList *this;
  float fVar2;
  ImVec2 p_min;
  char *unaff_retaddr;
  ImVec2 p;
  char *name;
  int i_1;
  float sz;
  int i;
  bool *in_stack_000000f0;
  char *in_stack_000000f8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  ImDrawList *in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int idx;
  float in_stack_fffffffffffffff0;
  ImVec2 in_stack_fffffffffffffff8;
  
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0x18ee,"Examples/Menu",GImGuiDemoMarkerCallbackUserData);
  }
  ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,false)
  ;
  ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,false)
  ;
  ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,false)
  ;
  bVar1 = ImGui::BeginMenu((char *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  if (bVar1) {
    ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                    (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,
                    false);
    ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                    (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,
                    false);
    ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                    (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,
                    false);
    bVar1 = ImGui::BeginMenu((char *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
    if (bVar1) {
      ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                      (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,
                      false);
      ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                      (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,
                      false);
      bVar1 = ImGui::BeginMenu((char *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
      if (bVar1) {
        ShowExampleMenuFile();
        ImGui::EndMenu();
      }
      ImGui::EndMenu();
    }
    ImGui::EndMenu();
  }
  ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,false)
  ;
  ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,false)
  ;
  ImGui::Separator();
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0x1908,"Examples/Menu/Options",GImGuiDemoMarkerCallbackUserData);
  }
  bVar1 = ImGui::BeginMenu((char *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  if (bVar1) {
    ImGui::MenuItem((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe0,(bool *)in_stack_ffffffffffffffd8,
                    SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff8,0.0,60.0);
    ImGui::BeginChild((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0),
                      (ImGuiWindowFlags)in_stack_ffffffffffffffc0);
    for (fVar2 = 0.0; (int)fVar2 < 10; fVar2 = (float)((int)fVar2 + 1)) {
      ImGui::Text("Scrolling Text %d",(ulong)(uint)fVar2);
    }
    ImGui::EndChild();
    ImGui::SliderFloat(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4
                       ,in_stack_ffffffffffffffd0,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ImGuiSliderFlags)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    ImGui::InputFloat(unaff_retaddr,(float *)in_stack_fffffffffffffff8,fVar2,
                      in_stack_fffffffffffffff0,
                      (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (ImGuiInputTextFlags)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    ImGui::Combo(in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8,
                 (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)in_stack_ffffffffffffffcc);
    ImGui::EndMenu();
  }
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
               ,0x1919,"Examples/Menu/Colors",GImGuiDemoMarkerCallbackUserData);
  }
  bVar1 = ImGui::BeginMenu((char *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  if (bVar1) {
    fVar2 = ImGui::GetTextLineHeight();
    for (idx = 0; idx < 0x35; idx = idx + 1) {
      this = (ImDrawList *)ImGui::GetStyleColorName(idx);
      p_min = ImGui::GetCursorScreenPos();
      in_stack_ffffffffffffffc0 = ImGui::GetWindowDrawList();
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,p_min.x + fVar2,p_min.y + fVar2);
      ImGui::GetColorU32((ImGuiCol)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      ImDrawList::AddRectFilled
                (this,(ImVec2 *)p_min,
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (ImU32)in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (ImDrawFlags)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,fVar2,fVar2);
      ImGui::Dummy((ImVec2 *)this);
      ImGui::SameLine((float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      SUB84(in_stack_ffffffffffffffc0,0));
      ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                      (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,
                      false);
    }
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu((char *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  if (bVar1) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x192e,"Examples/Menu/Append to an existing menu",GImGuiDemoMarkerCallbackUserData
                );
    }
    ImGui::Checkbox(in_stack_000000f8,in_stack_000000f0);
    ImGui::EndMenu();
  }
  ImGui::BeginMenu((char *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,false)
  ;
  ImGui::MenuItem((char *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),false,false)
  ;
  return;
}

Assistant:

static void ShowExampleMenuFile()
{
    IMGUI_DEMO_MARKER("Examples/Menu");
    ImGui::MenuItem("(demo menu)", NULL, false, false);
    if (ImGui::MenuItem("New")) {}
    if (ImGui::MenuItem("Open", "Ctrl+O")) {}
    if (ImGui::BeginMenu("Open Recent"))
    {
        ImGui::MenuItem("fish_hat.c");
        ImGui::MenuItem("fish_hat.inl");
        ImGui::MenuItem("fish_hat.h");
        if (ImGui::BeginMenu("More.."))
        {
            ImGui::MenuItem("Hello");
            ImGui::MenuItem("Sailor");
            if (ImGui::BeginMenu("Recurse.."))
            {
                ShowExampleMenuFile();
                ImGui::EndMenu();
            }
            ImGui::EndMenu();
        }
        ImGui::EndMenu();
    }
    if (ImGui::MenuItem("Save", "Ctrl+S")) {}
    if (ImGui::MenuItem("Save As..")) {}

    ImGui::Separator();
    IMGUI_DEMO_MARKER("Examples/Menu/Options");
    if (ImGui::BeginMenu("Options"))
    {
        static bool enabled = true;
        ImGui::MenuItem("Enabled", "", &enabled);
        ImGui::BeginChild("child", ImVec2(0, 60), true);
        for (int i = 0; i < 10; i++)
            ImGui::Text("Scrolling Text %d", i);
        ImGui::EndChild();
        static float f = 0.5f;
        static int n = 0;
        ImGui::SliderFloat("Value", &f, 0.0f, 1.0f);
        ImGui::InputFloat("Input", &f, 0.1f);
        ImGui::Combo("Combo", &n, "Yes\0No\0Maybe\0\0");
        ImGui::EndMenu();
    }

    IMGUI_DEMO_MARKER("Examples/Menu/Colors");
    if (ImGui::BeginMenu("Colors"))
    {
        float sz = ImGui::GetTextLineHeight();
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName((ImGuiCol)i);
            ImVec2 p = ImGui::GetCursorScreenPos();
            ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x + sz, p.y + sz), ImGui::GetColorU32((ImGuiCol)i));
            ImGui::Dummy(ImVec2(sz, sz));
            ImGui::SameLine();
            ImGui::MenuItem(name);
        }
        ImGui::EndMenu();
    }

    // Here we demonstrate appending again to the "Options" menu (which we already created above)
    // Of course in this demo it is a little bit silly that this function calls BeginMenu("Options") twice.
    // In a real code-base using it would make senses to use this feature from very different code locations.
    if (ImGui::BeginMenu("Options")) // <-- Append!
    {
        IMGUI_DEMO_MARKER("Examples/Menu/Append to an existing menu");
        static bool b = true;
        ImGui::Checkbox("SomeOption", &b);
        ImGui::EndMenu();
    }

    if (ImGui::BeginMenu("Disabled", false)) // Disabled
    {
        IM_ASSERT(0);
    }
    if (ImGui::MenuItem("Checked", NULL, true)) {}
    if (ImGui::MenuItem("Quit", "Alt+F4")) {}
}